

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *p_cp,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *fmt;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  opj_ppx *ptr;
  uint uVar7;
  uint uVar8;
  OPJ_BYTE *pOVar9;
  ulong uVar10;
  bool bVar11;
  OPJ_UINT32 l_N_ppm_1;
  OPJ_UINT32 l_N_ppm;
  uint local_54;
  opj_event_mgr_t *local_50;
  uint local_48;
  uint local_44;
  opj_cp_t *local_40;
  ulong local_38;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xf10,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
  }
  if (p_cp->ppm_buffer != (OPJ_BYTE *)0x0) {
    __assert_fail("p_cp->ppm_buffer == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xf12,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
  }
  if ((p_cp->field_0x90 & 1) == 0) {
    return 1;
  }
  uVar8 = p_cp->ppm_markers_count;
  if (uVar8 == 0) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = 0;
    uVar4 = 0;
    local_50 = p_manager;
    local_40 = p_cp;
    do {
      pOVar9 = p_cp->ppm_markers[uVar6].m_data;
      uVar2 = uVar5;
      if (pOVar9 != (OPJ_BYTE *)0x0) {
        uVar1 = p_cp->ppm_markers[uVar6].m_data_size;
        uVar10 = (ulong)(uVar5 - uVar1);
        if (uVar5 < uVar1) {
          uVar10 = 0;
        }
        uVar7 = uVar1 - uVar5;
        p_cp = local_40;
        uVar2 = (uint)uVar10;
        if (uVar5 <= uVar1 && uVar7 != 0) {
          pOVar9 = pOVar9 + uVar5;
          do {
            if (uVar7 < 4) goto LAB_001151e7;
            opj_read_bytes_LE(pOVar9,&local_44,4);
            uVar8 = uVar7 - 4;
            uVar4 = uVar4 + local_44;
            bVar11 = local_44 <= uVar8;
            uVar7 = uVar8 - local_44;
            if (!bVar11) {
              uVar10 = (ulong)(local_44 - uVar8);
            }
            uVar3 = (ulong)local_44;
            if (!bVar11) {
              uVar3 = 0;
            }
            pOVar9 = pOVar9 + uVar3 + 4;
          } while (bVar11 && uVar7 != 0);
          uVar8 = local_40->ppm_markers_count;
          p_cp = local_40;
          uVar2 = (uint)uVar10;
        }
      }
      uVar5 = uVar2;
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar8);
    p_manager = local_50;
    if (uVar5 != 0) {
      fmt = "Corrupted PPM markers\n";
      goto LAB_00115203;
    }
  }
  pOVar9 = (OPJ_BYTE *)opj_malloc((ulong)uVar4);
  p_cp->ppm_buffer = pOVar9;
  if (pOVar9 != (OPJ_BYTE *)0x0) {
    p_cp->ppm_len = uVar4;
    uVar8 = p_cp->ppm_markers_count;
    ptr = p_cp->ppm_markers;
    if (uVar8 != 0) {
      uVar6 = 0;
      uVar4 = 0;
      uVar5 = 0;
      local_50 = p_manager;
      do {
        pOVar9 = ptr[uVar6].m_data;
        if (pOVar9 != (OPJ_BYTE *)0x0) {
          uVar8 = ptr[uVar6].m_data_size;
          if (uVar4 < uVar8) {
            local_38 = (ulong)uVar4;
            local_48 = uVar4;
            memcpy(p_cp->ppm_buffer + uVar5,pOVar9,local_38);
            uVar5 = uVar5 + local_48;
            uVar8 = uVar8 - local_48;
            if (uVar8 != 0) {
              pOVar9 = pOVar9 + local_38;
              do {
                if (uVar8 < 4) goto LAB_001151e7;
                opj_read_bytes_LE(pOVar9,&local_54,4);
                pOVar9 = pOVar9 + 4;
                uVar8 = uVar8 - 4;
                if (uVar8 < local_54) {
                  memcpy(p_cp->ppm_buffer + uVar5,pOVar9,(ulong)uVar8);
                  uVar4 = local_54;
                  goto LAB_00115197;
                }
                memcpy(p_cp->ppm_buffer + uVar5,pOVar9,(ulong)local_54);
                pOVar9 = pOVar9 + local_54;
                uVar5 = uVar5 + local_54;
                uVar8 = uVar8 - local_54;
              } while (uVar8 != 0);
            }
            uVar4 = 0;
          }
          else {
            memcpy(p_cp->ppm_buffer + uVar5,pOVar9,(ulong)uVar8);
LAB_00115197:
            uVar4 = uVar4 - uVar8;
            uVar5 = uVar5 + uVar8;
          }
          opj_free(p_cp->ppm_markers[uVar6].m_data);
          ptr = p_cp->ppm_markers;
          ptr[uVar6].m_data = (OPJ_BYTE *)0x0;
          ptr[uVar6].m_data_size = 0;
          uVar8 = p_cp->ppm_markers_count;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar8);
      pOVar9 = p_cp->ppm_buffer;
      uVar4 = p_cp->ppm_len;
    }
    p_cp->ppm_data = pOVar9;
    p_cp->ppm_data_size = uVar4;
    p_cp->ppm_markers_count = 0;
    opj_free(ptr);
    p_cp->ppm_markers = (opj_ppx *)0x0;
    return 1;
  }
  fmt = "Not enough memory to read PPM marker\n";
LAB_00115203:
  opj_event_msg(p_manager,1,fmt);
  return 0;
LAB_001151e7:
  fmt = "Not enough bytes to read Nppm\n";
  p_manager = local_50;
  goto LAB_00115203;
}

Assistant:

static OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *p_cp, opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, l_ppm_data_size, l_N_ppm_remaining;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_manager != 00);
    assert(p_cp->ppm_buffer == NULL);

    if (p_cp->ppm == 0U) {
        return OPJ_TRUE;
    }

    l_ppm_data_size = 0U;
    l_N_ppm_remaining = 0U;
    for (i = 0U; i < p_cp->ppm_markers_count; ++i) {
        if (p_cp->ppm_markers[i].m_data !=
                NULL) { /* standard doesn't seem to require contiguous Zppm */
            OPJ_UINT32 l_N_ppm;
            OPJ_UINT32 l_data_size = p_cp->ppm_markers[i].m_data_size;
            const OPJ_BYTE* l_data = p_cp->ppm_markers[i].m_data;

            if (l_N_ppm_remaining >= l_data_size) {
                l_N_ppm_remaining -= l_data_size;
                l_data_size = 0U;
            } else {
                l_data += l_N_ppm_remaining;
                l_data_size -= l_N_ppm_remaining;
                l_N_ppm_remaining = 0U;
            }

            if (l_data_size > 0U) {
                do {
                    /* read Nppm */
                    if (l_data_size < 4U) {
                        /* clean up to be done on l_cp destruction */
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough bytes to read Nppm\n");
                        return OPJ_FALSE;
                    }
                    opj_read_bytes(l_data, &l_N_ppm, 4);
                    l_data += 4;
                    l_data_size -= 4;
                    l_ppm_data_size +=
                        l_N_ppm; /* can't overflow, max 256 markers of max 65536 bytes, that is when PPM markers are not corrupted which is checked elsewhere */

                    if (l_data_size >= l_N_ppm) {
                        l_data_size -= l_N_ppm;
                        l_data += l_N_ppm;
                    } else {
                        l_N_ppm_remaining = l_N_ppm - l_data_size;
                        l_data_size = 0U;
                    }
                } while (l_data_size > 0U);
            }
        }
    }

    if (l_N_ppm_remaining != 0U) {
        /* clean up to be done on l_cp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Corrupted PPM markers\n");
        return OPJ_FALSE;
    }

    p_cp->ppm_buffer = (OPJ_BYTE *) opj_malloc(l_ppm_data_size);
    if (p_cp->ppm_buffer == 00) {
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPM marker\n");
        return OPJ_FALSE;
    }
    p_cp->ppm_len = l_ppm_data_size;
    l_ppm_data_size = 0U;
    l_N_ppm_remaining = 0U;
    for (i = 0U; i < p_cp->ppm_markers_count; ++i) {
        if (p_cp->ppm_markers[i].m_data !=
                NULL) { /* standard doesn't seem to require contiguous Zppm */
            OPJ_UINT32 l_N_ppm;
            OPJ_UINT32 l_data_size = p_cp->ppm_markers[i].m_data_size;
            const OPJ_BYTE* l_data = p_cp->ppm_markers[i].m_data;

            if (l_N_ppm_remaining >= l_data_size) {
                memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_data_size);
                l_ppm_data_size += l_data_size;
                l_N_ppm_remaining -= l_data_size;
                l_data_size = 0U;
            } else {
                memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_N_ppm_remaining);
                l_ppm_data_size += l_N_ppm_remaining;
                l_data += l_N_ppm_remaining;
                l_data_size -= l_N_ppm_remaining;
                l_N_ppm_remaining = 0U;
            }

            if (l_data_size > 0U) {
                do {
                    /* read Nppm */
                    if (l_data_size < 4U) {
                        /* clean up to be done on l_cp destruction */
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough bytes to read Nppm\n");
                        return OPJ_FALSE;
                    }
                    opj_read_bytes(l_data, &l_N_ppm, 4);
                    l_data += 4;
                    l_data_size -= 4;

                    if (l_data_size >= l_N_ppm) {
                        memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_N_ppm);
                        l_ppm_data_size += l_N_ppm;
                        l_data_size -= l_N_ppm;
                        l_data += l_N_ppm;
                    } else {
                        memcpy(p_cp->ppm_buffer + l_ppm_data_size, l_data, l_data_size);
                        l_ppm_data_size += l_data_size;
                        l_N_ppm_remaining = l_N_ppm - l_data_size;
                        l_data_size = 0U;
                    }
                } while (l_data_size > 0U);
            }
            opj_free(p_cp->ppm_markers[i].m_data);
            p_cp->ppm_markers[i].m_data = NULL;
            p_cp->ppm_markers[i].m_data_size = 0U;
        }
    }

    p_cp->ppm_data = p_cp->ppm_buffer;
    p_cp->ppm_data_size = p_cp->ppm_len;

    p_cp->ppm_markers_count = 0U;
    opj_free(p_cp->ppm_markers);
    p_cp->ppm_markers = NULL;

    return OPJ_TRUE;
}